

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicgstab.h
# Opt level: O2

int BiCGSTAB<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,int64_t *max_iter,double *tol,
              TPZFMatrix<long_double> *residual,int FromCurrent)

{
  int iVar1;
  TPZFMatrix<long_double> *pTVar2;
  TPZFMatrix<long_double> *pTVar3;
  TPZFMatrix<long_double> *this;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble lVar5;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar6;
  longdouble in_ST5;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST6;
  longdouble in_ST7;
  ulong uVar9;
  double dVar10;
  double dVar11;
  TPZFMatrix<long_double> local_9c0;
  TPZFMatrix<long_double> omega;
  TPZFMatrix<long_double> v;
  TPZFMatrix<long_double> t;
  TPZFMatrix<long_double> s;
  TPZFMatrix<long_double> phat;
  TPZFMatrix<long_double> p;
  TPZFMatrix<long_double> alpha;
  TPZFMatrix<long_double> local_540;
  TPZFMatrix<long_double> shat;
  TPZFMatrix<long_double> rho_1;
  TPZFMatrix<long_double> local_390;
  TPZFMatrix<long_double> rtilde;
  TPZFMatrix<long_double> rho_2;
  TPZFMatrix<long_double> beta;
  TPZFMatrix<long_double> local_150;
  TPZFMatrix<long_double> resbackup;
  
  TPZFMatrix<long_double>::TPZFMatrix(&rho_1,1,1);
  TPZFMatrix<long_double>::TPZFMatrix(&rho_2,1,1);
  TPZFMatrix<long_double>::TPZFMatrix(&alpha,1,1);
  TPZFMatrix<long_double>::TPZFMatrix(&beta,1,1);
  pTVar2 = (TPZFMatrix<long_double> *)0x1;
  pTVar3 = pTVar2;
  TPZFMatrix<long_double>::TPZFMatrix(&omega,1,1);
  TPZFMatrix<long_double>::TPZFMatrix(&p);
  TPZFMatrix<long_double>::TPZFMatrix(&phat);
  TPZFMatrix<long_double>::TPZFMatrix(&s);
  TPZFMatrix<long_double>::TPZFMatrix(&shat);
  TPZFMatrix<long_double>::TPZFMatrix(&t);
  TPZFMatrix<long_double>::TPZFMatrix(&v);
  TPZFMatrix<long_double>::TPZFMatrix(&resbackup);
  this = &resbackup;
  if (residual != (TPZFMatrix<long_double> *)0x0) {
    this = residual;
  }
  Norm((longdouble *)b,pTVar3);
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    TPZFMatrix<long_double>::operator=(this,b);
  }
  else {
    in_ST7 = in_ST6;
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(A,x,b,this,0);
  }
  pTVar3 = this;
  lVar5 = in_ST7;
  TPZFMatrix<long_double>::TPZFMatrix(&rtilde,this);
  Norm((longdouble *)this,pTVar3);
  uVar9 = -(ulong)((double)in_ST0 == 0.0);
  dVar11 = (double)(~uVar9 & (ulong)(double)in_ST0 | uVar9 & 0x3ff0000000000000);
  dVar10 = (double)in_ST1;
  if (*tol <= dVar10 / dVar11) {
    for (; (long)pTVar2 <= *max_iter;
        pTVar2 = (TPZFMatrix<long_double> *)
                 ((long)&(pTVar2->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable
                         ._vptr_TPZSavable + 1)) {
      pTVar3 = this;
      Dot<long_double>(&rtilde,this);
      *rho_1.fElem = in_ST2;
      if (((double)in_ST2 == 0.0) && (!NAN((double)in_ST2))) {
        Norm((longdouble *)this,pTVar3);
        *tol = (double)in_ST3 / dVar11;
        iVar1 = 2;
        goto LAB_00cfe269;
      }
      if (pTVar2 == (TPZFMatrix<long_double> *)0x1) {
        lVar7 = lVar5;
        TPZFMatrix<long_double>::operator=(&p,this);
        lVar4 = in_ST7;
        in_ST2 = lVar5;
      }
      else {
        lVar5 = (*alpha.fElem / *omega.fElem) * (in_ST2 / *rho_2.fElem);
        *beta.fElem = lVar5;
        in_ST2 = in_ST7;
        lVar7 = in_ST7;
        TPZFMatrix<long_double>::operator*(&local_150,&v,*omega.fElem);
        TPZFMatrix<long_double>::operator-(&local_540,&p,&local_150);
        TPZFMatrix<long_double>::operator*(&local_390,&local_540,lVar5);
        TPZFMatrix<long_double>::operator+(&local_9c0,this,&local_390);
        TPZFMatrix<long_double>::operator=(&p,&local_9c0);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_9c0);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_390);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_540);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
        lVar4 = in_ST7;
      }
      (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&p,&phat,0);
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&phat,&v);
      lVar5 = *rho_1.fElem;
      Dot<long_double>(&rtilde,&v);
      *alpha.fElem = lVar5 / in_ST3;
      lVar8 = lVar7;
      lVar6 = lVar7;
      TPZFMatrix<long_double>::operator*(&local_390,&v,lVar5 / in_ST3);
      TPZFMatrix<long_double>::operator-(&local_9c0,this,&local_390);
      pTVar3 = &local_9c0;
      TPZFMatrix<long_double>::operator=(&s,&local_9c0);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_9c0);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_390);
      in_ST3 = lVar7;
      Norm((longdouble *)this,pTVar3);
      if ((double)in_ST4 / dVar11 < *tol) {
        TPZFMatrix<long_double>::operator*(&local_9c0,&phat,*alpha.fElem);
        TPZFMatrix<long_double>::operator+=(x,&local_9c0.super_TPZMatrix<long_double>);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_9c0);
        *tol = (double)in_ST4;
        goto LAB_00cfdd9a;
      }
      (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&s,&shat);
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&shat,&t);
      in_ST4 = lVar8;
      lVar5 = lVar6;
      Dot<long_double>(&t,&s);
      Dot<long_double>(&t,&t);
      in_ST7 = lVar5;
      TPZFMatrix<long_double>::operator=(&omega,in_ST5 / in_ST6);
      TPZFMatrix<long_double>::operator*(&local_390,&phat,*alpha.fElem);
      TPZFMatrix<long_double>::operator*(&local_540,&shat,*omega.fElem);
      TPZFMatrix<long_double>::operator+(&local_9c0,&local_390,&local_540);
      TPZFMatrix<long_double>::operator+=(x,&local_9c0.super_TPZMatrix<long_double>);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_9c0);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_540);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_390);
      TPZFMatrix<long_double>::operator*(&local_390,&t,*omega.fElem);
      TPZFMatrix<long_double>::operator-(&local_9c0,&s,&local_390);
      pTVar3 = &local_9c0;
      TPZFMatrix<long_double>::operator=(this,&local_9c0);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_9c0);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_390);
      *rho_2.fElem = *rho_1.fElem;
      in_ST5 = lVar6;
      in_ST6 = lVar5;
      lVar5 = in_ST7;
      Norm((longdouble *)this,pTVar3);
      dVar10 = (double)lVar4;
      if (dVar10 / dVar11 < *tol) {
        *tol = dVar10;
        *max_iter = (int64_t)pTVar2;
        goto LAB_00cfdd9a;
      }
      if (((double)*omega.fElem == 0.0) && (!NAN((double)*omega.fElem))) {
        Norm((longdouble *)this,pTVar3);
        *tol = (double)in_ST2 / dVar11;
        iVar1 = 3;
        goto LAB_00cfe269;
      }
    }
    *tol = dVar10;
    iVar1 = 1;
  }
  else {
    *tol = dVar10;
    *max_iter = 0;
LAB_00cfdd9a:
    iVar1 = 0;
  }
LAB_00cfe269:
  TPZFMatrix<long_double>::~TPZFMatrix(&rtilde);
  TPZFMatrix<long_double>::~TPZFMatrix(&resbackup);
  TPZFMatrix<long_double>::~TPZFMatrix(&v);
  TPZFMatrix<long_double>::~TPZFMatrix(&t);
  TPZFMatrix<long_double>::~TPZFMatrix(&shat);
  TPZFMatrix<long_double>::~TPZFMatrix(&s);
  TPZFMatrix<long_double>::~TPZFMatrix(&phat);
  TPZFMatrix<long_double>::~TPZFMatrix(&p);
  TPZFMatrix<long_double>::~TPZFMatrix(&omega);
  TPZFMatrix<long_double>::~TPZFMatrix(&beta);
  TPZFMatrix<long_double>::~TPZFMatrix(&alpha);
  TPZFMatrix<long_double>::~TPZFMatrix(&rho_2);
  TPZFMatrix<long_double>::~TPZFMatrix(&rho_1);
  return iVar1;
}

Assistant:

int 
BiCGSTAB(const Matrix &A, Vector &x, const Vector &b,
         /*const */Preconditioner &M, int64_t &max_iter, Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1), omega(1);
	Vector p, phat, s, shat, t, v;
	
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
	
	Real normb = TPZExtractVal::val(Norm(b));
	if(FromCurrent) A.MultAdd(x,b,r,-1.,1.);
	else {
		x.Zero();
		r = b;
	}
	
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = TPZExtractVal::val(Norm(r))) / normb < tol) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		rho_1(0) = Dot(rtilde, r);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = TPZExtractVal::val(Norm(r)) / normb;
			return 2;
		}
		if (i == 1)
			p = r;
		else {
			beta(0) = (rho_1(0)/rho_2(0)) * (alpha(0)/omega(0));
			p = r + beta(0) * (p - omega(0) * v);
		}
		
		M.Solve(p, phat);
		A.Multiply(phat, v);
		alpha(0) = rho_1(0) / Dot(rtilde, v);
		s = r - alpha(0) * v;
		if ((resid = TPZExtractVal::val(Norm(r))) / normb < tol) {
			x += alpha(0) * phat;
			tol = resid;
			return 0;
		}
		M.Solve(s, shat);
		A.Multiply(shat, t);
		omega = Dot(t,s) / Dot(t,t);
		x += alpha(0) * phat + omega(0) * shat;
		r = s - omega(0) * t;
		
		rho_2(0) = rho_1(0);
		if ((resid = TPZExtractVal::val(Norm(r))) / normb < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
		if (TPZExtractVal::val(omega(0)) == ((Real)0.)) {
			tol = TPZExtractVal::val(Norm(r)) / normb;
			return 3;
		}
	}
	
	tol = resid;
	return 1;
}